

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O2

void FACT_INTERNAL_DestroySound(FACTSoundInstance *sound)

{
  uint8_t *puVar1;
  FACTWave *pFVar2;
  FACTCue *cue;
  FACTTrackInstance *pFVar3;
  long lVar4;
  ulong uVar5;
  
  sound->parentCue->playingSound = (FACTSoundInstance *)0x0;
  lVar4 = 0;
  for (uVar5 = 0; uVar5 < sound->sound->trackCount; uVar5 = uVar5 + 1) {
    pFVar3 = sound->tracks;
    pFVar2 = *(FACTWave **)((long)&(pFVar3->activeWave).wave + lVar4);
    if (pFVar2 != (FACTWave *)0x0) {
      FACTWave_Destroy(pFVar2);
      pFVar3 = sound->tracks;
    }
    pFVar2 = *(FACTWave **)((long)&(pFVar3->upcomingWave).wave + lVar4);
    if (pFVar2 != (FACTWave *)0x0) {
      FACTWave_Destroy(pFVar2);
      pFVar3 = sound->tracks;
    }
    (*sound->parentCue->parentBank->parentEngine->pFree)(*(void **)((long)&pFVar3->events + lVar4));
    lVar4 = lVar4 + 0x68;
  }
  (*sound->parentCue->parentBank->parentEngine->pFree)(sound->tracks);
  cue = sound->parentCue;
  uVar5 = (ulong)sound->sound->category;
  if (uVar5 != 0xffff) {
    puVar1 = &cue->parentBank->parentEngine->categories[uVar5].instanceCount;
    *puVar1 = *puVar1 + 0xff;
  }
  cue->state = cue->state & 0xffffffc7 | 0x20;
  puVar1 = &cue->data->instanceCount;
  *puVar1 = *puVar1 + 0xff;
  FACT_INTERNAL_SendCueNotification(cue,NOTIFY_CUESTOP,'\x03');
  (*sound->parentCue->parentBank->parentEngine->pFree)(sound);
  return;
}

Assistant:

void FACT_INTERNAL_DestroySound(FACTSoundInstance *sound)
{
	uint8_t i;

	sound->parentCue->playingSound = NULL;
	for (i = 0; i < sound->sound->trackCount; i += 1)
	{
		if (sound->tracks[i].activeWave.wave != NULL)
		{
			FACTWave_Destroy(
				sound->tracks[i].activeWave.wave
			);
		}
		if (sound->tracks[i].upcomingWave.wave != NULL)
		{
			FACTWave_Destroy(
				sound->tracks[i].upcomingWave.wave
			);
		}
		sound->parentCue->parentBank->parentEngine->pFree(
			sound->tracks[i].events
		);
	}
	sound->parentCue->parentBank->parentEngine->pFree(sound->tracks);

	if (sound->sound->category != FACTCATEGORY_INVALID)
	{
		sound->parentCue->parentBank->parentEngine->categories[
			sound->sound->category
		].instanceCount -= 1;
	}

	/* TODO: if (sound->parentCue->playingSounds == NULL) */
	{
		sound->parentCue->state |= FACT_STATE_STOPPED;
		sound->parentCue->state &= ~(FACT_STATE_PLAYING | FACT_STATE_STOPPING);
		sound->parentCue->data->instanceCount -= 1;

		FACT_INTERNAL_SendCueNotification(sound->parentCue, NOTIFY_CUESTOP, FACTNOTIFICATIONTYPE_CUESTOP);
	}
	sound->parentCue->parentBank->parentEngine->pFree(sound);
}